

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

void __thiscall
embree::sse2::UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::BinBoundsAndCenter::
binBoundsAndCenter(BinBoundsAndCenter *this,PrimRefMB *ref,LBBox3fa *bounds_o,Vec3fa *center_o)

{
  Geometry *pGVar1;
  LBBox3fa lbounds;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pGVar1 = (this->scene->geometries).items[(uint)(ref->lbounds).bounds0.lower.field_0.m128[3]].ptr;
  (*(pGVar1->super_RefCount)._vptr_RefCount[0x3e])
            (&local_58,pGVar1,&this->space,(ulong)(uint)(ref->lbounds).bounds0.upper.field_0.m128[3]
             ,&this->time_range);
  (bounds_o->bounds0).lower.field_0.m128[0] = local_58;
  (bounds_o->bounds0).lower.field_0.m128[1] = fStack_54;
  (bounds_o->bounds0).lower.field_0.m128[2] = fStack_50;
  (bounds_o->bounds0).lower.field_0.m128[3] = fStack_4c;
  (bounds_o->bounds0).upper.field_0.m128[0] = local_48;
  (bounds_o->bounds0).upper.field_0.m128[1] = fStack_44;
  (bounds_o->bounds0).upper.field_0.m128[2] = fStack_40;
  (bounds_o->bounds0).upper.field_0.m128[3] = fStack_3c;
  (bounds_o->bounds1).lower.field_0.m128[0] = local_38;
  (bounds_o->bounds1).lower.field_0.m128[1] = fStack_34;
  (bounds_o->bounds1).lower.field_0.m128[2] = fStack_30;
  (bounds_o->bounds1).lower.field_0.m128[3] = fStack_2c;
  (bounds_o->bounds1).upper.field_0.m128[0] = local_28;
  (bounds_o->bounds1).upper.field_0.m128[1] = fStack_24;
  (bounds_o->bounds1).upper.field_0.m128[2] = fStack_20;
  (bounds_o->bounds1).upper.field_0.m128[3] = fStack_1c;
  (center_o->field_0).m128[0] = local_48 * 0.5 + local_28 * 0.5 + local_58 * 0.5 + local_38 * 0.5;
  (center_o->field_0).m128[1] =
       fStack_44 * 0.5 + fStack_24 * 0.5 + fStack_54 * 0.5 + fStack_34 * 0.5;
  (center_o->field_0).m128[2] =
       fStack_40 * 0.5 + fStack_20 * 0.5 + fStack_50 * 0.5 + fStack_30 * 0.5;
  (center_o->field_0).m128[3] =
       fStack_3c * 0.5 + fStack_1c * 0.5 + fStack_4c * 0.5 + fStack_2c * 0.5;
  return;
}

Assistant:

__noinline void binBoundsAndCenter (const PrimRefMB& ref, LBBox3fa& bounds_o, Vec3fa& center_o) const // __noinline is workaround for ICC16 bug under MacOSX
          {
            Geometry* mesh = scene->get(ref.geomID());
            LBBox3fa lbounds = mesh->vlinearBounds(space,ref.primID(),time_range);
            bounds_o = lbounds;
            center_o = center2(lbounds.interpolate(0.5f));
          }